

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NavSaveLastChildNavWindowIntoParent(ImGuiWindow *nav_window)

{
  bool bVar1;
  ImGuiWindow *local_18;
  ImGuiWindow *parent;
  ImGuiWindow *nav_window_local;
  
  local_18 = nav_window;
  while( true ) {
    bVar1 = false;
    if ((local_18 != (ImGuiWindow *)0x0) && (bVar1 = false, (local_18->Flags & 0x1000000U) != 0)) {
      bVar1 = (local_18->Flags & 0x14000000U) == 0;
    }
    if (!bVar1) break;
    local_18 = local_18->ParentWindow;
  }
  if ((local_18 != (ImGuiWindow *)0x0) && (local_18 != nav_window)) {
    local_18->NavLastChildNavWindow = nav_window;
  }
  return;
}

Assistant:

static void ImGui::NavSaveLastChildNavWindowIntoParent(ImGuiWindow* nav_window)
{
    ImGuiWindow* parent = nav_window;
    while (parent && (parent->Flags & ImGuiWindowFlags_ChildWindow) != 0 && (parent->Flags & (ImGuiWindowFlags_Popup | ImGuiWindowFlags_ChildMenu)) == 0)
        parent = parent->ParentWindow;
    if (parent && parent != nav_window)
        parent->NavLastChildNavWindow = nav_window;
}